

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RenderTarget.cpp
# Opt level: O0

void __thiscall sf::RenderTarget::applyBlendMode(RenderTarget *this,BlendMode *mode)

{
  PFNGLBLENDEQUATIONEXTPROC p_Var1;
  PFNGLBLENDEQUATIONSEPARATEEXTPROC p_Var2;
  PFNGLBLENDFUNCPROC p_Var3;
  PFNGLBLENDFUNCSEPARATEEXTPROC p_Var4;
  Uint32 UVar5;
  Uint32 UVar6;
  Uint32 UVar7;
  Uint32 UVar8;
  ostream *poVar9;
  undefined8 *in_RSI;
  long in_RDI;
  Equation in_stack_ffffffffffffffb0;
  
  p_Var4 = sf_glad_glBlendFuncSeparateEXT;
  p_Var3 = sf_glad_glBlendFunc;
  if (SF_GLAD_GL_EXT_blend_func_separate == 0) {
    UVar5 = anon_unknown.dwarf_1f658a::RenderTargetImpl::factorToGlConstant
                      (in_stack_ffffffffffffffb0);
    UVar6 = anon_unknown.dwarf_1f658a::RenderTargetImpl::factorToGlConstant
                      (in_stack_ffffffffffffffb0);
    (*p_Var3)(UVar5,UVar6);
  }
  else {
    UVar5 = anon_unknown.dwarf_1f658a::RenderTargetImpl::factorToGlConstant
                      (in_stack_ffffffffffffffb0);
    UVar6 = anon_unknown.dwarf_1f658a::RenderTargetImpl::factorToGlConstant
                      (in_stack_ffffffffffffffb0);
    UVar7 = anon_unknown.dwarf_1f658a::RenderTargetImpl::factorToGlConstant
                      (in_stack_ffffffffffffffb0);
    UVar8 = anon_unknown.dwarf_1f658a::RenderTargetImpl::factorToGlConstant
                      (in_stack_ffffffffffffffb0);
    (*p_Var4)(UVar5,UVar6,UVar7,UVar8);
  }
  p_Var2 = sf_glad_glBlendEquationSeparateEXT;
  p_Var1 = sf_glad_glBlendEquationEXT;
  if ((SF_GLAD_GL_EXT_blend_minmax == 0) && (SF_GLAD_GL_EXT_blend_subtract == 0)) {
    if (((*(int *)(in_RSI + 1) != 0) || (*(int *)((long)in_RSI + 0x14) != 0)) &&
       ((applyBlendMode::warned & 1U) == 0)) {
      poVar9 = err();
      poVar9 = std::operator<<(poVar9,
                               "OpenGL extension EXT_blend_minmax and EXT_blend_subtract unavailable"
                              );
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      poVar9 = err();
      poVar9 = std::operator<<(poVar9,"Selecting a blend equation not possible");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      poVar9 = err();
      poVar9 = std::operator<<(poVar9,"Ensure that hardware acceleration is enabled if available");
      std::ostream::operator<<(poVar9,std::endl<char,std::char_traits<char>>);
      applyBlendMode::warned = true;
    }
  }
  else if (SF_GLAD_GL_EXT_blend_equation_separate == 0) {
    UVar5 = anon_unknown.dwarf_1f658a::RenderTargetImpl::equationToGlConstant
                      (in_stack_ffffffffffffffb0);
    (*p_Var1)(UVar5);
  }
  else {
    UVar5 = anon_unknown.dwarf_1f658a::RenderTargetImpl::equationToGlConstant
                      (in_stack_ffffffffffffffb0);
    UVar6 = anon_unknown.dwarf_1f658a::RenderTargetImpl::equationToGlConstant
                      (in_stack_ffffffffffffffb0);
    (*p_Var2)(UVar5,UVar6);
  }
  *(undefined8 *)(in_RDI + 0x15c) = *in_RSI;
  *(undefined8 *)(in_RDI + 0x164) = in_RSI[1];
  *(undefined8 *)(in_RDI + 0x16c) = in_RSI[2];
  return;
}

Assistant:

void RenderTarget::applyBlendMode(const BlendMode& mode)
{
    using RenderTargetImpl::factorToGlConstant;
    using RenderTargetImpl::equationToGlConstant;

    // Apply the blend mode, falling back to the non-separate versions if necessary
    if (GLEXT_blend_func_separate)
    {
        glCheck(GLEXT_glBlendFuncSeparate(
            factorToGlConstant(mode.colorSrcFactor), factorToGlConstant(mode.colorDstFactor),
            factorToGlConstant(mode.alphaSrcFactor), factorToGlConstant(mode.alphaDstFactor)));
    }
    else
    {
        glCheck(glBlendFunc(
            factorToGlConstant(mode.colorSrcFactor),
            factorToGlConstant(mode.colorDstFactor)));
    }

    if (GLEXT_blend_minmax || GLEXT_blend_subtract)
    {
        if (GLEXT_blend_equation_separate)
        {
            glCheck(GLEXT_glBlendEquationSeparate(
                equationToGlConstant(mode.colorEquation),
                equationToGlConstant(mode.alphaEquation)));
        }
        else
        {
            glCheck(GLEXT_glBlendEquation(equationToGlConstant(mode.colorEquation)));
        }
    }
    else if ((mode.colorEquation != BlendMode::Add) || (mode.alphaEquation != BlendMode::Add))
    {
        static bool warned = false;

        if (!warned)
        {
#ifdef SFML_OPENGL_ES
            err() << "OpenGL ES extension OES_blend_subtract unavailable" << std::endl;
#else
            err() << "OpenGL extension EXT_blend_minmax and EXT_blend_subtract unavailable" << std::endl;
#endif
            err() << "Selecting a blend equation not possible" << std::endl;
            err() << "Ensure that hardware acceleration is enabled if available" << std::endl;

            warned = true;
        }
    }

    m_cache.lastBlendMode = mode;
}